

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

void __thiscall CEPlanet::SetReference(CEPlanet *this,CEPlanet *reference)

{
  if (this->reference_ != (CEPlanet *)0x0) {
    (*(this->reference_->super_CEBody).super_CESkyCoord._vptr_CESkyCoord[1])();
  }
  this->reference_ = reference;
  this->cached_jd_ = -1e+30;
  return;
}

Assistant:

void CEPlanet::SetReference(CEPlanet* reference)
{
    if (reference_ != nullptr) {
        // redirect and delete
        delete reference_;
        reference_ = nullptr;
    }
    
    reference_ = reference;

    // Reset cached date so that coordinates are recomputed
    cached_jd_ = -1.0e30;
}